

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppModel.h
# Opt level: O1

void __thiscall hiberlite::Column::~Column(Column *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->storage_type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->storage_type).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

inline Column(std::string _n="", std::string _s="") : name(_n), storage_type(_s) {}